

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::PickElement::backward_impl
          (PickElement *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  pointer puVar7;
  float *pfVar8;
  float *pfVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  byte bVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ushort uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  int iVar31;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  if (i != 0) {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x625,
                  "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if (this->pval == (uint *)0x0) {
    pvVar6 = this->pvals;
    if (pvVar6 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                    ,0x62c,
                    "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    puVar7 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar19 = (long)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)puVar7;
    if (lVar19 != 0) {
      auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar3 = (dEdxi->d).nd;
      pfVar8 = dEdf->v;
      pfVar9 = dEdxi->v;
      uVar4 = (dEdxi->d).bd;
      uVar5 = (dEdxi->d).d[0];
      uVar16 = 0;
      auVar26 = vpbroadcastq_avx512f();
      do {
        iVar31 = 1;
        if (uVar3 != 0) {
          uVar17 = 0;
          auVar27 = vmovdqa64_avx512f(auVar23);
          do {
            auVar28 = vpbroadcastq_avx512f();
            auVar29 = vmovdqa64_avx512f(auVar27);
            auVar27 = vporq_avx512f(auVar28,auVar24);
            auVar28 = vporq_avx512f(auVar28,auVar25);
            uVar13 = vpcmpuq_avx512f(auVar28,auVar26,2);
            bVar14 = (byte)uVar13;
            uVar13 = vpcmpuq_avx512f(auVar27,auVar26,2);
            bVar15 = (byte)uVar13;
            uVar21 = CONCAT11(bVar15,bVar14);
            auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar17));
            auVar28._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar27._4_4_;
            auVar28._0_4_ = (uint)(bVar14 & 1) * auVar27._0_4_;
            auVar28._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar27._8_4_;
            auVar28._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar27._12_4_;
            auVar28._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar27._16_4_;
            auVar28._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar27._20_4_;
            auVar28._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar27._24_4_;
            auVar28._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar27._28_4_;
            auVar28._32_4_ = (uint)(bVar15 & 1) * auVar27._32_4_;
            auVar28._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar27._36_4_;
            auVar28._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar27._40_4_;
            auVar28._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar27._44_4_;
            auVar28._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar27._48_4_;
            auVar28._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar27._52_4_;
            auVar28._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar27._56_4_;
            auVar28._60_4_ = (uint)(bVar15 >> 7) * auVar27._60_4_;
            uVar17 = uVar17 + 0x10;
            auVar27 = vpmulld_avx512f(auVar28,auVar29);
          } while (((ulong)uVar3 + 0xf & 0xfffffffffffffff0) != uVar17);
          auVar27 = vmovdqa32_avx512f(auVar27);
          auVar30._0_4_ =
               (uint)(bVar14 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar29._0_4_;
          bVar10 = (bool)((byte)(uVar21 >> 1) & 1);
          auVar30._4_4_ = (uint)bVar10 * auVar27._4_4_ | (uint)!bVar10 * auVar29._4_4_;
          bVar10 = (bool)((byte)(uVar21 >> 2) & 1);
          auVar30._8_4_ = (uint)bVar10 * auVar27._8_4_ | (uint)!bVar10 * auVar29._8_4_;
          bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
          auVar30._12_4_ = (uint)bVar10 * auVar27._12_4_ | (uint)!bVar10 * auVar29._12_4_;
          bVar10 = (bool)((byte)(uVar21 >> 4) & 1);
          auVar30._16_4_ = (uint)bVar10 * auVar27._16_4_ | (uint)!bVar10 * auVar29._16_4_;
          bVar10 = (bool)((byte)(uVar21 >> 5) & 1);
          auVar30._20_4_ = (uint)bVar10 * auVar27._20_4_ | (uint)!bVar10 * auVar29._20_4_;
          bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
          auVar30._24_4_ = (uint)bVar10 * auVar27._24_4_ | (uint)!bVar10 * auVar29._24_4_;
          bVar10 = (bool)((byte)(uVar21 >> 7) & 1);
          auVar30._28_4_ = (uint)bVar10 * auVar27._28_4_ | (uint)!bVar10 * auVar29._28_4_;
          auVar30._32_4_ =
               (uint)(bVar15 & 1) * auVar27._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar29._32_4_;
          bVar10 = (bool)(bVar15 >> 1 & 1);
          auVar30._36_4_ = (uint)bVar10 * auVar27._36_4_ | (uint)!bVar10 * auVar29._36_4_;
          bVar10 = (bool)(bVar15 >> 2 & 1);
          auVar30._40_4_ = (uint)bVar10 * auVar27._40_4_ | (uint)!bVar10 * auVar29._40_4_;
          bVar10 = (bool)(bVar15 >> 3 & 1);
          auVar30._44_4_ = (uint)bVar10 * auVar27._44_4_ | (uint)!bVar10 * auVar29._44_4_;
          bVar10 = (bool)(bVar15 >> 4 & 1);
          auVar30._48_4_ = (uint)bVar10 * auVar27._48_4_ | (uint)!bVar10 * auVar29._48_4_;
          bVar10 = (bool)(bVar15 >> 5 & 1);
          auVar30._52_4_ = (uint)bVar10 * auVar27._52_4_ | (uint)!bVar10 * auVar29._52_4_;
          bVar10 = (bool)(bVar15 >> 6 & 1);
          auVar30._56_4_ = (uint)bVar10 * auVar27._56_4_ | (uint)!bVar10 * auVar29._56_4_;
          auVar30._60_4_ =
               (uint)(bVar15 >> 7) * auVar27._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar29._60_4_;
          auVar22 = vextracti64x4_avx512f(auVar30,1);
          auVar27 = vpmulld_avx512f(auVar30,ZEXT3264(auVar22));
          auVar11 = vpmulld_avx(auVar27._0_16_,auVar27._16_16_);
          auVar12 = vpshufd_avx(auVar11,0xee);
          auVar11 = vpmulld_avx(auVar11,auVar12);
          auVar12 = vpshufd_avx(auVar11,0x55);
          auVar11 = vpmulld_avx(auVar11,auVar12);
          iVar31 = auVar11._0_4_;
        }
        uVar20 = (ulong)puVar7[uVar16];
        uVar17 = (ulong)(dEdxi->d).d[1];
        if (uVar3 < 2) {
          uVar17 = 1;
        }
        uVar17 = uVar17 * uVar5;
        if (uVar17 < uVar20 || uVar17 - uVar20 == 0) goto LAB_001bf9f4;
        pfVar1 = pfVar8 + uVar16;
        uVar18 = (int)(uVar16 % (ulong)uVar4) * iVar31;
        uVar16 = (ulong)((int)uVar16 + 1);
        pfVar9[uVar18 + uVar20] = *pfVar1 + pfVar9[uVar18 + uVar20];
      } while (uVar16 < (ulong)(lVar19 >> 2));
    }
  }
  else {
    fVar2 = *dEdf->v;
    Tensor::operator*(&local_50,dEdxi);
    uVar16 = (ulong)*this->pval;
    if (local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value - uVar16 == 0 ||
        local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value < (long)uVar16) {
LAB_001bf9f4:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                   );
    }
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data[uVar16] =
         fVar2 + local_50.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data[uVar16];
  }
  return;
}

Assistant:

void PickElement::backward_impl(const vector<const Tensor*>& xs,
                    const Tensor& fx,
                    const Tensor& dEdf,
                    unsigned i,
                    Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("PickElement not yet implemented for CUDA");
#else
  if(pval) {
    (*dEdxi)(*pval) += dEdf.v[0];
  } else {
    assert(pvals);
    for(unsigned b = 0; b < pvals->size(); ++b)
      dEdxi.batch_matrix(b)((*pvals)[b]) += dEdf.v[b];
  }
#endif
}